

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O2

Ivy_Obj_t * Ivy_Miter(Ivy_Man_t *p,Vec_Ptr_t *vPairs)

{
  uint uVar1;
  Ivy_Obj_t *pIVar2;
  long lVar3;
  
  uVar1 = vPairs->nSize;
  if ((int)uVar1 < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyOper.c"
                  ,0x10b,"Ivy_Obj_t *Ivy_Miter(Ivy_Man_t *, Vec_Ptr_t *)");
  }
  if ((uVar1 & 1) == 0) {
    for (lVar3 = 0; lVar3 < (int)uVar1; lVar3 = lVar3 + 2) {
      pIVar2 = Ivy_Exor(p,(Ivy_Obj_t *)vPairs->pArray[lVar3],(Ivy_Obj_t *)vPairs->pArray[lVar3 + 1])
      ;
      *(ulong *)((long)vPairs->pArray + lVar3 * 4) = (ulong)pIVar2 ^ 1;
      uVar1 = vPairs->nSize;
    }
    vPairs->nSize = (int)uVar1 / 2;
    pIVar2 = Ivy_Multi_rec(p,(Ivy_Obj_t **)vPairs->pArray,(int)uVar1 / 2,IVY_AND);
    return (Ivy_Obj_t *)((ulong)pIVar2 ^ 1);
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyOper.c"
                ,0x10c,"Ivy_Obj_t *Ivy_Miter(Ivy_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Ivy_Obj_t * Ivy_Miter( Ivy_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Ivy_Not( Ivy_Exor( p, (Ivy_Obj_t *)vPairs->pArray[i], (Ivy_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Ivy_Not( Ivy_Multi_rec( p, (Ivy_Obj_t **)vPairs->pArray, vPairs->nSize, IVY_AND ) );
}